

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prof.c
# Opt level: O1

void __thiscall CProficiencies::UpdateProfPoints(CProficiencies *this)

{
  CHAR_DATA *ch;
  char *pcVar1;
  basic_string_view<char> fmt;
  basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> args;
  string buffer;
  long *local_298 [2];
  long local_288 [2];
  char *local_278 [2];
  char *local_268;
  buffer<char> local_258;
  char local_238 [536];
  
  ch = this->ch;
  if (this->pawardedtime + 0xe10 <= (ch->played + current_time) - ch->logon) {
    pcVar1 = get_char_color(ch,"yellow");
    local_268 = END_COLOR(this->ch);
    local_258.size_ = 0;
    local_258._vptr_buffer = (_func_int **)&PTR_grow_00457340;
    local_258.capacity_ = 500;
    fmt.size_ = 0x30;
    fmt.data_ = "{}You feel ready to study new proficiencies.{}\n\r";
    args.field_1.values_ =
         (value<fmt::v9::basic_format_context<fmt::v9::appender,_char>_> *)local_278;
    args.desc_ = 0xcc;
    local_278[0] = pcVar1;
    local_258.ptr_ = local_238;
    ::fmt::v9::detail::vformat_to<char>(&local_258,fmt,args,(locale_ref)0x0);
    local_298[0] = local_288;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_298,local_258.ptr_,local_258.ptr_ + local_258.size_);
    if (local_258.ptr_ != local_238) {
      operator_delete(local_258.ptr_,local_258.capacity_);
    }
    if (this->pawardedtime == 0) {
      send_to_char("See HELP PROFICIENCY for more information.\n\r",this->ch);
    }
    this->points = this->points + 5;
    send_to_char((char *)local_298[0],this->ch);
    this->pawardedtime = (this->ch->played + current_time) - this->ch->logon;
    if (local_298[0] != local_288) {
      operator_delete(local_298[0],local_288[0] + 1);
    }
  }
  return;
}

Assistant:

void CProficiencies::UpdateProfPoints()
{
	if (ch->played + (current_time - ch->logon) < pawardedtime + 3600)
		return;

	auto buffer = fmt::format("{}You feel ready to study new proficiencies.{}\n\r", 
		get_char_color(ch,"yellow"), 
		END_COLOR(ch));

	if (pawardedtime == 0)
		send_to_char("See HELP PROFICIENCY for more information.\n\r", ch);

	points += POINTS_PER_HOUR;

	send_to_char(buffer.c_str(), ch);

	pawardedtime = ch->played + (current_time - ch->logon);
}